

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderSetSchema(xmlTextReaderPtr reader,xmlSchemaPtr schema)

{
  xmlSchemaValidCtxtPtr ctxt;
  xmlSchemaSAXPlugPtr pxVar1;
  int iVar2;
  xmlSchemaPtr schema_00;
  
  iVar2 = -1;
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (schema == (xmlSchemaPtr)0x0) {
    if (reader->xsdPlug != (xmlSchemaSAXPlugPtr)0x0) {
      xmlSchemaSAXUnplug(reader->xsdPlug);
      reader->xsdPlug = (xmlSchemaSAXPlugPtr)0x0;
    }
    if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
      if (reader->xsdPreserveCtxt == 0) {
        xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
      }
      reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
    }
    reader->xsdPreserveCtxt = 0;
    schema_00 = reader->xsdSchemas;
    iVar2 = 0;
    if (schema_00 == (xmlSchemaPtr)0x0) {
      return 0;
    }
  }
  else {
    if (reader->mode != 0) {
      return -1;
    }
    if (reader->xsdPlug != (xmlSchemaSAXPlugPtr)0x0) {
      xmlSchemaSAXUnplug(reader->xsdPlug);
      reader->xsdPlug = (xmlSchemaSAXPlugPtr)0x0;
    }
    if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
      if (reader->xsdPreserveCtxt == 0) {
        xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
      }
      reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
    }
    reader->xsdPreserveCtxt = 0;
    if (reader->xsdSchemas != (xmlSchemaPtr)0x0) {
      xmlSchemaFree(reader->xsdSchemas);
      reader->xsdSchemas = (xmlSchemaPtr)0x0;
    }
    ctxt = xmlSchemaNewValidCtxt(schema);
    reader->xsdValidCtxt = ctxt;
    if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
      pxVar1 = xmlSchemaSAXPlug(ctxt,&reader->ctxt->sax,&reader->ctxt->userData);
      reader->xsdPlug = pxVar1;
      if (pxVar1 != (xmlSchemaSAXPlugPtr)0x0) {
        xmlSchemaValidateSetLocator(reader->xsdValidCtxt,xmlTextReaderLocator,reader);
        if (reader->errorFunc != (xmlTextReaderErrorFunc)0x0) {
          xmlSchemaSetValidErrors
                    (reader->xsdValidCtxt,xmlTextReaderValidityErrorRelay,
                     xmlTextReaderValidityWarningRelay,reader);
        }
        if (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0) {
          xmlSchemaSetValidStructuredErrors
                    (reader->xsdValidCtxt,xmlTextReaderValidityStructuredRelay,reader);
        }
        reader->xsdValidErrors = 0;
        reader->validate = XML_TEXTREADER_VALIDATE_XSD;
        return 0;
      }
      xmlSchemaFree(reader->xsdSchemas);
      reader->xsdSchemas = (xmlSchemaPtr)0x0;
      xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
      reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
      return -1;
    }
    schema_00 = reader->xsdSchemas;
  }
  xmlSchemaFree(schema_00);
  reader->xsdSchemas = (xmlSchemaPtr)0x0;
  return iVar2;
}

Assistant:

int
xmlTextReaderSetSchema(xmlTextReaderPtr reader, xmlSchemaPtr schema) {
    if (reader == NULL)
        return(-1);
    if (schema == NULL) {
	if (reader->xsdPlug != NULL) {
	    xmlSchemaSAXUnplug(reader->xsdPlug);
	    reader->xsdPlug = NULL;
	}
        if (reader->xsdValidCtxt != NULL) {
	    if (! reader->xsdPreserveCtxt)
		xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	    reader->xsdValidCtxt = NULL;
        }
	reader->xsdPreserveCtxt = 0;
        if (reader->xsdSchemas != NULL) {
	    xmlSchemaFree(reader->xsdSchemas);
	    reader->xsdSchemas = NULL;
	}
	return(0);
    }
    if (reader->mode != XML_TEXTREADER_MODE_INITIAL)
	return(-1);
    if (reader->xsdPlug != NULL) {
	xmlSchemaSAXUnplug(reader->xsdPlug);
	reader->xsdPlug = NULL;
    }
    if (reader->xsdValidCtxt != NULL) {
	if (! reader->xsdPreserveCtxt)
	    xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	reader->xsdValidCtxt = NULL;
    }
    reader->xsdPreserveCtxt = 0;
    if (reader->xsdSchemas != NULL) {
	xmlSchemaFree(reader->xsdSchemas);
	reader->xsdSchemas = NULL;
    }
    reader->xsdValidCtxt = xmlSchemaNewValidCtxt(schema);
    if (reader->xsdValidCtxt == NULL) {
	xmlSchemaFree(reader->xsdSchemas);
	reader->xsdSchemas = NULL;
        return(-1);
    }
    reader->xsdPlug = xmlSchemaSAXPlug(reader->xsdValidCtxt,
                                       &(reader->ctxt->sax),
				       &(reader->ctxt->userData));
    if (reader->xsdPlug == NULL) {
	xmlSchemaFree(reader->xsdSchemas);
	reader->xsdSchemas = NULL;
	xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	reader->xsdValidCtxt = NULL;
	return(-1);
    }
    xmlSchemaValidateSetLocator(reader->xsdValidCtxt,
                                xmlTextReaderLocator,
				(void *) reader);

    if (reader->errorFunc != NULL) {
	xmlSchemaSetValidErrors(reader->xsdValidCtxt,
			xmlTextReaderValidityErrorRelay,
			xmlTextReaderValidityWarningRelay,
			reader);
    }
	if (reader->sErrorFunc != NULL) {
		xmlSchemaSetValidStructuredErrors(reader->xsdValidCtxt,
			xmlTextReaderValidityStructuredRelay,
			reader);
    }
    reader->xsdValidErrors = 0;
    reader->validate = XML_TEXTREADER_VALIDATE_XSD;
    return(0);
}